

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

token * skiwi::anon_unknown_2::take
                  (token *__return_storage_ptr__,
                  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  pointer ptVar1;
  
  ptVar1 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_start == ptVar1) {
    throw_parse_error(no_tokens);
    ptVar1 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  token::token(__return_storage_ptr__,ptVar1 + -1);
  token::operator=((token *)&(anonymous_namespace)::popped_token,__return_storage_ptr__);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::pop_back(tokens);
  return __return_storage_ptr__;
}

Assistant:

token take(std::vector<token>& tokens)
    {
    if (tokens.empty())
      {
      throw_parse_error(no_tokens);
      }
    token t = tokens.back();
    popped_token = t;
    tokens.pop_back();
    return t;
    }